

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_287390::CAPIExternalCommand::configureAttributeNoContext
          (CAPIExternalCommand *this,StringRef name,StringRef value)

{
  int iVar1;
  size_t sVar2;
  SmallVectorImpl<std::__cxx11::string> *this_00;
  long *plVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  SmallString<4096U> wd;
  StringRef local_1058;
  undefined1 *local_1048;
  undefined8 local_1040;
  undefined1 local_1038;
  undefined7 uStack_1037;
  SmallVectorImpl<char> local_1028;
  undefined1 local_1018 [4096];
  
  sVar2 = name.Length;
  plVar3 = (long *)name.Data;
  local_1058.Length = value.Length;
  local_1058.Data = value.Data;
  if ((long)sVar2 < 10) {
    if (sVar2 == 4) {
      if ((int)*plVar3 != 0x73706564) {
        return false;
      }
      this_00 = (SmallVectorImpl<std::__cxx11::string> *)&this->depsPaths;
    }
    else {
      if (sVar2 != 7) {
        return false;
      }
      if (*(int *)((long)plVar3 + 3) != 0x73747570 || (int)*plVar3 != 0x7074756f) {
        return false;
      }
      this_00 = (SmallVectorImpl<std::__cxx11::string> *)&this->outputNodeNames;
    }
    llvm::
    SmallVectorImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::clear((SmallVectorImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)this_00);
    llvm::SmallVectorImpl<std::__cxx11::string>::emplace_back<llvm::StringRef&>(this_00,&local_1058)
    ;
    return true;
  }
  if (sVar2 == 10) {
    if ((short)plVar3[1] == 0x656c && *plVar3 == 0x7974732d73706564) {
      if ((long)local_1058.Length < 0xf) {
        if (local_1058.Length == 6) {
          if (*(short *)((long)local_1058.Data + 4) == 0x6465 &&
              (int)*(long *)local_1058.Data == 0x73756e75) {
            this->depsFormat = llb_buildsystem_dependency_data_format_unused;
            return true;
          }
        }
        else {
          if (local_1058.Length != 8) {
            return false;
          }
          if (*(long *)local_1058.Data == 0x656c6966656b616d) {
            this->depsFormat = llb_buildsystem_dependency_data_format_makefile;
            return true;
          }
        }
      }
      else if (local_1058.Length == 0xf) {
        if (*(long *)((long)local_1058.Data + 7) == 0x6f666e692d79636e &&
            *(long *)local_1058.Data == 0x6e65646e65706564) {
          this->depsFormat = llb_buildsystem_dependency_data_format_dependencyinfo;
          return true;
        }
      }
      else {
        if (local_1058.Length != 0x24) {
          return false;
        }
        iVar1 = bcmp(local_1058.Data,"makefile-ignoring-subsequent-outputs",0x24);
        if (iVar1 == 0) {
          this->depsFormat =
               llb_buildsystem_dependency_data_format_makefile_ignoring_subsequent_outputs;
          return true;
        }
      }
    }
  }
  else if (sVar2 == 0x11) {
    auVar5[0] = -((char)*plVar3 == 'w');
    auVar5[1] = -(*(char *)((long)plVar3 + 1) == 'o');
    auVar5[2] = -(*(char *)((long)plVar3 + 2) == 'r');
    auVar5[3] = -(*(char *)((long)plVar3 + 3) == 'k');
    auVar5[4] = -(*(char *)((long)plVar3 + 4) == 'i');
    auVar5[5] = -(*(char *)((long)plVar3 + 5) == 'n');
    auVar5[6] = -(*(char *)((long)plVar3 + 6) == 'g');
    auVar5[7] = -(*(char *)((long)plVar3 + 7) == '-');
    auVar5[8] = -((char)plVar3[1] == 'd');
    auVar5[9] = -(*(char *)((long)plVar3 + 9) == 'i');
    auVar5[10] = -(*(char *)((long)plVar3 + 10) == 'r');
    auVar5[0xb] = -(*(char *)((long)plVar3 + 0xb) == 'e');
    auVar5[0xc] = -(*(char *)((long)plVar3 + 0xc) == 'c');
    auVar5[0xd] = -(*(char *)((long)plVar3 + 0xd) == 't');
    auVar5[0xe] = -(*(char *)((long)plVar3 + 0xe) == 'o');
    auVar5[0xf] = -(*(char *)((long)plVar3 + 0xf) == 'r');
    auVar7[0] = -((char)plVar3[2] == 'y');
    auVar7[1] = 0xff;
    auVar7[2] = 0xff;
    auVar7[3] = 0xff;
    auVar7[4] = 0xff;
    auVar7[5] = 0xff;
    auVar7[6] = 0xff;
    auVar7[7] = 0xff;
    auVar7[8] = 0xff;
    auVar7[9] = 0xff;
    auVar7[10] = 0xff;
    auVar7[0xb] = 0xff;
    auVar7[0xc] = 0xff;
    auVar7[0xd] = 0xff;
    auVar7[0xe] = 0xff;
    auVar7[0xf] = 0xff;
    auVar7 = auVar7 & auVar5;
    if ((ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) | (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar7 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar7 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar7 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar7 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar7 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar7 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar7 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar7 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar7 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar7 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar7 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar7[0xf] >> 7) << 0xf) == 0xffff) {
      local_1028.super_SmallVectorTemplateBase<char,_true>.
      super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size = 0;
      local_1028.super_SmallVectorTemplateBase<char,_true>.
      super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Capacity = 0x1000;
      local_1028.super_SmallVectorTemplateBase<char,_true>.
      super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX = local_1018;
      llvm::SmallVectorImpl<char>::append<char_const*,void>
                (&local_1028,local_1058.Data,(char *)(local_1058.Length + (long)local_1058.Data));
      llvm::sys::fs::make_absolute(&local_1028);
      if ((undefined1 *)
          local_1028.super_SmallVectorTemplateBase<char,_true>.
          super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX ==
          (undefined1 *)0x0) {
        local_1048 = &local_1038;
        local_1040 = 0;
        local_1038 = 0;
      }
      else {
        local_1048 = &local_1038;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1048,
                   local_1028.super_SmallVectorTemplateBase<char,_true>.
                   super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX,
                   (undefined1 *)
                   ((long)local_1028.super_SmallVectorTemplateBase<char,_true>.
                          super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX +
                   (local_1028.super_SmallVectorTemplateBase<char,_true>.
                    super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase._8_8_ &
                   0xffffffff)));
      }
      std::__cxx11::string::operator=((string *)&this->workingDirectory,(string *)&local_1048);
      if (local_1048 != &local_1038) {
        operator_delete(local_1048,CONCAT71(uStack_1037,local_1038) + 1);
      }
      if ((undefined1 *)
          local_1028.super_SmallVectorTemplateBase<char,_true>.
          super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX == local_1018) {
        return true;
      }
      free(local_1028.super_SmallVectorTemplateBase<char,_true>.
           super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX);
      return true;
    }
  }
  else {
    if (sVar2 != 0x1d) {
      return false;
    }
    auVar6[0] = -(*(char *)((long)plVar3 + 0xd) == 'n');
    auVar6[1] = -(*(char *)((long)plVar3 + 0xe) == 'e');
    auVar6[2] = -(*(char *)((long)plVar3 + 0xf) == 'r');
    auVar6[3] = -((char)plVar3[2] == 's');
    auVar6[4] = -(*(char *)((long)plVar3 + 0x11) == 'h');
    auVar6[5] = -(*(char *)((long)plVar3 + 0x12) == 'i');
    auVar6[6] = -(*(char *)((long)plVar3 + 0x13) == 'p');
    auVar6[7] = -(*(char *)((long)plVar3 + 0x14) == '-');
    auVar6[8] = -(*(char *)((long)plVar3 + 0x15) == 'a');
    auVar6[9] = -(*(char *)((long)plVar3 + 0x16) == 'n');
    auVar6[10] = -(*(char *)((long)plVar3 + 0x17) == 'a');
    auVar6[0xb] = -((char)plVar3[3] == 'l');
    auVar6[0xc] = -(*(char *)((long)plVar3 + 0x19) == 'y');
    auVar6[0xd] = -(*(char *)((long)plVar3 + 0x1a) == 's');
    auVar6[0xe] = -(*(char *)((long)plVar3 + 0x1b) == 'i');
    auVar6[0xf] = -(*(char *)((long)plVar3 + 0x1c) == 's');
    auVar4[0] = -((char)*plVar3 == 'r');
    auVar4[1] = -(*(char *)((long)plVar3 + 1) == 'e');
    auVar4[2] = -(*(char *)((long)plVar3 + 2) == 'p');
    auVar4[3] = -(*(char *)((long)plVar3 + 3) == 'a');
    auVar4[4] = -(*(char *)((long)plVar3 + 4) == 'i');
    auVar4[5] = -(*(char *)((long)plVar3 + 5) == 'r');
    auVar4[6] = -(*(char *)((long)plVar3 + 6) == '-');
    auVar4[7] = -(*(char *)((long)plVar3 + 7) == 'v');
    auVar4[8] = -((char)plVar3[1] == 'i');
    auVar4[9] = -(*(char *)((long)plVar3 + 9) == 'a');
    auVar4[10] = -(*(char *)((long)plVar3 + 10) == '-');
    auVar4[0xb] = -(*(char *)((long)plVar3 + 0xb) == 'o');
    auVar4[0xc] = -(*(char *)((long)plVar3 + 0xc) == 'w');
    auVar4[0xd] = -(*(char *)((long)plVar3 + 0xd) == 'n');
    auVar4[0xe] = -(*(char *)((long)plVar3 + 0xe) == 'e');
    auVar4[0xf] = -(*(char *)((long)plVar3 + 0xf) == 'r');
    auVar4 = auVar4 & auVar6;
    if ((ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) | (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar4 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar4 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar4 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar4 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar4 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar4 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar4 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar4 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar4 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar4 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar4 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar4 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar4 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar4[0xf] >> 7) << 0xf) == 0xffff) {
      if (local_1058.Length == 5) {
        if (*(char *)((long)local_1058.Data + 4) == 'e' &&
            (int)*(long *)local_1058.Data == 0x736c6166) {
          (this->super_ExternalCommand).super_Command.repairViaOwnershipAnalysis = false;
          return true;
        }
      }
      else if ((local_1058.Length == 4) && ((int)*(long *)local_1058.Data == 0x65757274)) {
        (this->super_ExternalCommand).super_Command.repairViaOwnershipAnalysis = true;
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool configureAttributeNoContext(StringRef name, StringRef value) {
    if (name == "deps") {
      depsPaths.clear();
      depsPaths.emplace_back(value);
    } else if (name == "deps-style") {
      if (value == "unused") {
        depsFormat = llb_buildsystem_dependency_data_format_unused;
      } else if (value == "makefile") {
        depsFormat = llb_buildsystem_dependency_data_format_makefile;
      } else if (value == "dependency-info") {
        depsFormat = llb_buildsystem_dependency_data_format_dependencyinfo;
      } else if (value == "makefile-ignoring-subsequent-outputs") {
        depsFormat = llb_buildsystem_dependency_data_format_makefile_ignoring_subsequent_outputs;
      } else {
        return false;
      }
    } else if (name == "repair-via-ownership-analysis") {
      if (value == "true") {
        repairViaOwnershipAnalysis = true;
        return true;
      } else if (value == "false") {
        repairViaOwnershipAnalysis = false;
        return true;
      } else {
        return false;
      }
    } else if (name == "working-directory") {
      // Ensure the working directory is absolute. This will make sure any
      // relative directories are interpreted as relative to the CWD at the time
      // the rule is defined.
      SmallString<PATH_MAX> wd = value;
      llvm::sys::fs::make_absolute(wd);
      workingDirectory = StringRef(wd);
    } else if (name == "outputs") {
      outputNodeNames.clear();
      outputNodeNames.emplace_back(value);
    } else {
      return false;
    }
    return true;
  }